

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

bool google::protobuf::safe_strto64(string *str,int64 *value)

{
  bool bVar1;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)str);
  bVar1 = safe_int_internal<long>(&local_30,value);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool safe_strto64(const string& str, int64* value) {
  return safe_int_internal(str, value);
}